

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

json_t * do_deep_copy(json_t *json,hashtable_t *parents)

{
  undefined8 uVar1;
  int iVar2;
  void *iter;
  char *key;
  json_t *pjVar3;
  json_t *pjVar4;
  ulong uVar5;
  json_array_t *array;
  char loop_key [19];
  size_t local_50;
  char local_48 [24];
  
  if (json == (json_t *)0x0) goto switchD_00114f67_default;
  switch(json->type) {
  case JSON_OBJECT:
    iVar2 = jsonp_loop_check(parents,json,local_48,0x13,&local_50);
    if (iVar2 == 0) {
      pjVar3 = json_object();
      if (pjVar3 != (json_t *)0x0) {
        if (json->type == JSON_OBJECT) {
          for (iter = hashtable_iter((hashtable_t *)(json + 2)); iter != (void *)0x0;
              iter = hashtable_iter_next((hashtable_t *)(json + 2),iter)) {
            key = (char *)hashtable_iter_key(iter);
            pjVar4 = (json_t *)hashtable_iter_value(iter);
            pjVar4 = do_deep_copy(pjVar4,parents);
            iVar2 = json_object_set_new_nocheck(pjVar3,key,pjVar4);
            if (iVar2 != 0) goto LAB_001150dc;
            if (json->type != JSON_OBJECT) break;
          }
        }
        goto LAB_001150e7;
      }
LAB_001150e4:
      pjVar3 = (json_t *)0x0;
LAB_001150e7:
      hashtable_del(parents,local_48,local_50);
      return pjVar3;
    }
    break;
  case JSON_ARRAY:
    iVar2 = jsonp_loop_check(parents,json,local_48,0x13,&local_50);
    if (iVar2 == 0) {
      pjVar3 = json_array();
      if (pjVar3 != (json_t *)0x0) {
        uVar5 = 0;
        do {
          if ((json->type != JSON_ARRAY) || (*(ulong *)(json + 4) <= uVar5)) goto LAB_001150e7;
          if (uVar5 < *(ulong *)(json + 4)) {
            pjVar4 = *(json_t **)(*(long *)(json + 6) + uVar5 * 8);
          }
          else {
            pjVar4 = (json_t *)0x0;
          }
          pjVar4 = do_deep_copy(pjVar4,parents);
          iVar2 = json_array_append_new(pjVar3,pjVar4);
          uVar5 = uVar5 + 1;
        } while (iVar2 == 0);
LAB_001150dc:
        json_delete(pjVar3);
      }
      goto LAB_001150e4;
    }
    break;
  case JSON_STRING:
    pjVar3 = string_create(*(char **)(json + 2),*(size_t *)(json + 4),0);
    return pjVar3;
  case JSON_INTEGER:
    uVar1 = *(undefined8 *)(json + 2);
    pjVar3 = (json_t *)jsonp_malloc(0x10);
    if (pjVar3 != (json_t *)0x0) {
      pjVar3->type = JSON_INTEGER;
      *(undefined8 *)(pjVar3 + 2) = uVar1;
      return pjVar3;
    }
  default:
switchD_00114f67_default:
    json = (json_t *)0x0;
    goto switchD_00114f67_caseD_5;
  case JSON_REAL:
    pjVar3 = json_real_copy(json);
    return pjVar3;
  case JSON_TRUE:
  case JSON_FALSE:
  case JSON_NULL:
    goto switchD_00114f67_caseD_5;
  }
  json = (json_t *)0x0;
switchD_00114f67_caseD_5:
  return json;
}

Assistant:

json_t *do_deep_copy(const json_t *json, hashtable_t *parents) {
    if (!json)
        return NULL;

    switch (json_typeof(json)) {
        case JSON_OBJECT:
            return json_object_deep_copy(json, parents);
        case JSON_ARRAY:
            return json_array_deep_copy(json, parents);
            /* for the rest of the types, deep copying doesn't differ from
               shallow copying */
        case JSON_STRING:
            return json_string_copy(json);
        case JSON_INTEGER:
            return json_integer_copy(json);
        case JSON_REAL:
            return json_real_copy(json);
        case JSON_TRUE:
        case JSON_FALSE:
        case JSON_NULL:
            return (json_t *) json;
        default:
            return NULL;
    }
}